

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O2

int IDAInitialSetup(IDAMem IDA_mem)

{
  int iVar1;
  IDAMem pIVar2;
  int error_code;
  char *msgfmt;
  
  if (IDA_mem->ida_suppressalg != 0) {
    if (IDA_mem->ida_phi[0]->ops->nvwrmsnormmask ==
        (_func_sunrealtype_N_Vector_N_Vector_N_Vector *)0x0) {
      msgfmt = "A required vector operation is not implemented.";
      error_code = -0x16;
      iVar1 = 0x7c4;
      goto LAB_0010d423;
    }
    if (IDA_mem->ida_id == (N_Vector)0x0) {
      msgfmt = "id = NULL but suppressalg option on.";
      error_code = -0x16;
      iVar1 = 0x7cd;
      goto LAB_0010d423;
    }
  }
  if (IDA_mem->ida_itol == 0) {
    msgfmt = "No integration tolerances have been specified.";
    error_code = -0x16;
    iVar1 = 0x7d5;
  }
  else {
    pIVar2 = IDA_mem;
    if (IDA_mem->ida_user_efun != 0) {
      pIVar2 = (IDAMem)IDA_mem->ida_user_data;
    }
    IDA_mem->ida_edata = pIVar2;
    iVar1 = (*IDA_mem->ida_efun)(IDA_mem->ida_phi[0],IDA_mem->ida_ewt,pIVar2);
    if (iVar1 == 0) {
      if ((IDA_mem->ida_constraintsSet == 0) ||
         (iVar1 = N_VConstrMask(IDA_mem->ida_constraints,IDA_mem->ida_phi[0],IDA_mem->ida_tempv2),
         iVar1 != 0)) {
        if ((IDA_mem->ida_linit == (_func_int_IDAMemRec_ptr *)0x0) ||
           (iVar1 = (*IDA_mem->ida_linit)(IDA_mem), iVar1 == 0)) {
          iVar1 = idaNlsInit(IDA_mem);
          if (iVar1 == 0) {
            return 0;
          }
          msgfmt = "The nonlinear solver\'s init routine failed.";
          error_code = -0xf;
          iVar1 = 0x80e;
        }
        else {
          msgfmt = "The linear solver\'s init routine failed.";
          error_code = -5;
          iVar1 = 0x803;
        }
      }
      else {
        msgfmt = "y0 fails to satisfy constraints.";
        error_code = -0x16;
        iVar1 = 0x7f7;
      }
    }
    else if (IDA_mem->ida_itol == 3) {
      msgfmt = "The user-provide EwtSet function failed.";
      error_code = -0x16;
      iVar1 = 0x7e5;
    }
    else {
      msgfmt = "Some initial ewt component = 0.0 illegal.";
      error_code = -0x16;
      iVar1 = 0x7ea;
    }
  }
LAB_0010d423:
  IDAProcessError(IDA_mem,error_code,iVar1,"IDAInitialSetup",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c",
                  msgfmt);
  return error_code;
}

Assistant:

int IDAInitialSetup(IDAMem IDA_mem)
{
  sunbooleantype conOK;
  int ier;

  /* Test for more vector operations, depending on options */
  if (IDA_mem->ida_suppressalg)
  {
    if (IDA_mem->ida_phi[0]->ops->nvwrmsnormmask == NULL)
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_NVECTOR);
      return (IDA_ILL_INPUT);
    }
  }

  /* Test id vector for legality */
  if (IDA_mem->ida_suppressalg && (IDA_mem->ida_id == NULL))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_MISSING_ID);
    return (IDA_ILL_INPUT);
  }

  /* Did the user specify tolerances? */
  if (IDA_mem->ida_itol == IDA_NN)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NO_TOLS);
    return (IDA_ILL_INPUT);
  }

  /* Set data for efun */
  if (IDA_mem->ida_user_efun) { IDA_mem->ida_edata = IDA_mem->ida_user_data; }
  else { IDA_mem->ida_edata = IDA_mem; }

  /* Initial error weight vector */
  ier = IDA_mem->ida_efun(IDA_mem->ida_phi[0], IDA_mem->ida_ewt,
                          IDA_mem->ida_edata);
  if (ier != 0)
  {
    if (IDA_mem->ida_itol == IDA_WF)
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_FAIL_EWT);
    }
    else
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_EWT);
    }
    return (IDA_ILL_INPUT);
  }

  /* Check to see if y0 satisfies constraints. */
  if (IDA_mem->ida_constraintsSet)
  {
    conOK = N_VConstrMask(IDA_mem->ida_constraints, IDA_mem->ida_phi[0],
                          IDA_mem->ida_tempv2);
    if (!conOK)
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_Y0_FAIL_CONSTR);
      return (IDA_ILL_INPUT);
    }
  }

  /* Call linit function if it exists. */
  if (IDA_mem->ida_linit != NULL)
  {
    ier = IDA_mem->ida_linit(IDA_mem);
    if (ier != 0)
    {
      IDAProcessError(IDA_mem, IDA_LINIT_FAIL, __LINE__, __func__, __FILE__,
                      MSG_LINIT_FAIL);
      return (IDA_LINIT_FAIL);
    }
  }

  /* Initialize the nonlinear solver (must occur after linear solver is initialize) so
   * that lsetup and lsolve pointers have been set */
  ier = idaNlsInit(IDA_mem);
  if (ier != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_NLS_INIT_FAIL, __LINE__, __func__, __FILE__,
                    MSG_NLS_INIT_FAIL);
    return (IDA_NLS_INIT_FAIL);
  }

  return (IDA_SUCCESS);
}